

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O1

void read_and_discard_scanlines(j_decompress_ptr cinfo,JDIMENSION num_lines)

{
  jpeg_decomp_master *pjVar1;
  jpeg_color_deconverter *pjVar2;
  jpeg_color_quantizer *pjVar3;
  _func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *p_Var4;
  boolean *scanlines;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var5;
  JSAMPLE dummy_sample [1];
  JSAMPROW dummy_row;
  undefined1 local_31;
  undefined1 *local_30;
  
  pjVar1 = cinfo->master;
  local_30 = &local_31;
  local_31 = 0;
  pjVar2 = cinfo->cconvert;
  if ((pjVar2 == (jpeg_color_deconverter *)0x0) ||
     (p_Var5 = pjVar2->color_convert,
     p_Var5 == (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0)) {
    scanlines = (boolean *)0x0;
    p_Var5 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0;
  }
  else {
    pjVar2->color_convert = noop_convert;
    scanlines = (boolean *)&local_30;
  }
  pjVar3 = cinfo->cquantize;
  if ((pjVar3 == (jpeg_color_quantizer *)0x0) ||
     (p_Var4 = pjVar3->color_quantize,
     p_Var4 == (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0)) {
    p_Var4 = (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0;
  }
  else {
    pjVar3->color_quantize = noop_quantize;
  }
  if ((*(int *)((long)&pjVar1[1].prepare_for_output_pass + 4) != 0) &&
     (cinfo->max_v_samp_factor == 2)) {
    scanlines = &cinfo->upsample[2].need_context_rows;
  }
  if (num_lines != 0) {
    do {
      jpeg_read_scanlines(cinfo,(JSAMPARRAY)scanlines,1);
      num_lines = num_lines - 1;
    } while (num_lines != 0);
  }
  if (p_Var5 != (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0) {
    cinfo->cconvert->color_convert = p_Var5;
  }
  if (p_Var4 != (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0) {
    cinfo->cquantize->color_quantize = p_Var4;
  }
  return;
}

Assistant:

LOCAL(void)
read_and_discard_scanlines(j_decompress_ptr cinfo, JDIMENSION num_lines)
{
  JDIMENSION n;
  my_master_ptr master = (my_master_ptr)cinfo->master;
  JSAMPLE dummy_sample[1] = { 0 };
  JSAMPROW dummy_row = dummy_sample;
  JSAMPARRAY scanlines = NULL;
  void (*color_convert) (j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION input_row, JSAMPARRAY output_buf,
                         int num_rows) = NULL;
  void (*color_quantize) (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                          JSAMPARRAY output_buf, int num_rows) = NULL;

  if (cinfo->cconvert && cinfo->cconvert->color_convert) {
    color_convert = cinfo->cconvert->color_convert;
    cinfo->cconvert->color_convert = noop_convert;
    /* This just prevents UBSan from complaining about adding 0 to a NULL
     * pointer.  The pointer isn't actually used.
     */
    scanlines = &dummy_row;
  }

  if (cinfo->cquantize && cinfo->cquantize->color_quantize) {
    color_quantize = cinfo->cquantize->color_quantize;
    cinfo->cquantize->color_quantize = noop_quantize;
  }

  if (master->using_merged_upsample && cinfo->max_v_samp_factor == 2) {
    my_merged_upsample_ptr upsample = (my_merged_upsample_ptr)cinfo->upsample;
    scanlines = &upsample->spare_row;
  }

  for (n = 0; n < num_lines; n++)
    jpeg_read_scanlines(cinfo, scanlines, 1);

  if (color_convert)
    cinfo->cconvert->color_convert = color_convert;

  if (color_quantize)
    cinfo->cquantize->color_quantize = color_quantize;
}